

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

bool __thiscall
Clasp::DefaultUnfoundedCheck::MinimalityCheck::partialCheck(MinimalityCheck *this,uint32 level)

{
  if (level < this->low) {
    this->next = this->next + (level - this->low);
    this->low = level;
  }
  return this->next == level || this->next == 0;
}

Assistant:

bool DefaultUnfoundedCheck::MinimalityCheck::partialCheck(uint32 level) {
	if (level < low) {
		next -= (low - level);
		low   = level;
	}
	return !next || next == level;
}